

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  QObject *pQVar2;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QPointer<QHttpNetworkConnection> *this_00;
  QObject *url;
  Data *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  url = in_RDI;
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_0049dfd0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  in_RDI[0x18] = (QObject)0x0;
  in_RDI[0x19] = (QObject)0x0;
  in_RDI[0x1a] = (QObject)0x0;
  in_RDI[0x1b] = (QObject)0x0;
  in_RDI[0x1c] = (QObject)0x0;
  in_RDI[0x1d] = (QObject)0x0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  pQVar2 = in_RDI + 0x28;
  this_00 = (QPointer<QHttpNetworkConnection> *)&stack0xfffffffffffffff0;
  QUrl::QUrl((QUrl *)this_00);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)in_stack_fffffffffffffff0,(QUrl *)url,
             (Operation)((ulong)in_RDI >> 0x20),(Priority)in_RDI);
  QUrl::~QUrl((QUrl *)this_00);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  in_RDI[0x50] = (QObject)0x0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  in_RDI[0x58] = (QObject)0x0;
  *(undefined4 *)(in_RDI + 0x5c) = 3;
  QAuthenticator::QAuthenticator((QAuthenticator *)(in_RDI + 0x60));
  QAuthenticator::QAuthenticator((QAuthenticator *)(in_RDI + 0x68));
  in_RDI[0x70] = (QObject)0x0;
  in_RDI[0x71] = (QObject)0x0;
  std::unique_ptr<QAbstractProtocolHandler,std::default_delete<QAbstractProtocolHandler>>::
  unique_ptr<std::default_delete<QAbstractProtocolHandler>,void>
            ((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_> *
             )this_00,pQVar2);
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QMultiMap
            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f7a92);
  in_RDI[0x88] = (QObject)0x0;
  in_RDI[0x89] = (QObject)0x0;
  QList<QSslError>::QList((QList<QSslError> *)0x2f7ab1);
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)
             (in_RDI + 0xa8),(QSslConfiguration *)0x0);
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QList
            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2f7ae2);
  QByteArray::QByteArray((QByteArray *)0x2f7af3);
  *(undefined4 *)(in_RDI + 0xe8) = 2;
  QPointer<QHttpNetworkConnection>::QPointer(this_00,pQVar2);
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x2f7b24);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel()
    : socket(nullptr)
    , ssl(false)
    , isInitialized(false)
    , state(IdleState)
    , reply(nullptr)
    , written(0)
    , bytesTotal(0)
    , resendCurrent(false)
    , lastStatus(0)
    , pendingEncrypt(false)
    , reconnectAttempts(reconnectAttemptsDefault)
    , authenticationCredentialsSent(false)
    , proxyCredentialsSent(false)
    , protocolHandler(nullptr)
#ifndef QT_NO_SSL
    , ignoreAllSslErrors(false)
#endif
    , pipeliningSupported(PipeliningSupportUnknown)
    , networkLayerPreference(QAbstractSocket::AnyIPProtocol)
    , connection(nullptr)
{
    // Inlining this function in the header leads to compiler error on
    // release-armv5, on at least timebox 9.2 and 10.1.
}